

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

Bool ParseInt(TidyDocImpl *doc,TidyOptionImpl *entry)

{
  StreamIn *in;
  tchar c;
  Bool BVar1;
  uint c_00;
  Bool BVar2;
  ulong val;
  
  c = SkipWhite(&doc->config);
  BVar1 = prvTidyIsDigit(c);
  if (BVar1 == no) {
    BVar1 = no;
  }
  else {
    val = 0;
    do {
      if ((doc->config).c == 0xffffffff) {
        c_00 = 0xffffffff;
      }
      else {
        in = (doc->config).cfgIn;
        if (in == (StreamIn *)0x0) {
          c_00 = 0xffffffff;
        }
        else {
          c_00 = prvTidyReadChar(in);
        }
        (doc->config).c = c_00;
      }
      val = (ulong)(c - 0x30) + val * 10;
      BVar2 = prvTidyIsDigit(c_00);
      c = c_00;
    } while (BVar2 != no);
    if (BVar1 != no) {
      prvTidySetOptionInt(doc,entry->id,val);
      return yes;
    }
    BVar1 = yes;
  }
  prvTidyReportBadArgument(doc,entry->name);
  return BVar1;
}

Assistant:

Bool ParseInt( TidyDocImpl* doc, const TidyOptionImpl* entry )
{
    ulong number = 0;
    Bool digits = no;
    TidyConfigImpl* cfg = &doc->config;
    tchar c = SkipWhite( cfg );

    while ( TY_(IsDigit)(c) )
    {
        number = c - '0' + (10 * number);
        digits = yes;
        c = AdvanceChar( cfg );
    }

    if ( !digits )
        TY_(ReportBadArgument)( doc, entry->name );
    else
        TY_(SetOptionInt)( doc, entry->id, number );
    return digits;
}